

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integral_image_simd.cpp
# Opt level: O0

void compute_integral_img_simd_early_cast_int(uint8_t *gray_image,integral_image *iimage)

{
  undefined8 *puVar1;
  undefined1 (*pauVar2) [16];
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  ulong uVar21;
  undefined4 uVar22;
  int *in_RSI;
  long in_RDI;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [64];
  __m256 v_iimage;
  __m256 v_float;
  __m256i v_int;
  size_t i;
  __m256 factor256;
  float prev_row_sum;
  uint32_t row_sum_1;
  __m128i add_row_sums;
  __m128 prev_iimage_float;
  __m128 prev_row_sums_cast;
  __m128i prev_row_sums;
  __m128i curr_row_sums_1;
  __m256i img_sad_sum_1;
  __m256i img_rep_mask_1;
  size_t i_2;
  __m256i row_sums_1;
  size_t j;
  __m128 factor;
  float *iimage_data;
  uint32_t row_sum;
  __m128i curr_row_sums;
  __m256i img_sad_sum;
  __m256i img_rep_mask;
  size_t i_1;
  __m256i row_sums;
  size_t aligned_width;
  uint32_t *iimage_idata;
  __m256i ZERO;
  __m256i PACK;
  __m256i MASK;
  int height;
  int width;
  int data_width;
  ulong local_848;
  int local_814;
  undefined8 local_810;
  undefined8 uStack_808;
  ulong local_768;
  undefined8 uStack_748;
  ulong local_738;
  int local_714;
  ulong local_6a8;
  undefined8 local_6a0;
  undefined8 uStack_688;
  undefined8 local_380;
  undefined8 uStack_378;
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined4 uStack_204;
  float local_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  iVar3 = in_RSI[4];
  iVar4 = *in_RSI;
  iVar5 = in_RSI[1];
  auVar12 = vpunpcklqdq_avx(ZEXT816(0xff),ZEXT816(0xffff));
  auVar13 = vpunpcklqdq_avx(ZEXT816(0xffffff),ZEXT816(0xffffffff));
  uStack_70 = auVar13._0_8_;
  uStack_68 = auVar13._8_8_;
  auVar13 = vpinsrd_avx(ZEXT416(0),2,1);
  auVar13 = vpinsrd_avx(auVar13,4,2);
  auVar13 = vpinsrd_avx(auVar13,6,3);
  auVar10 = vpinsrd_avx(ZEXT416(1),3,1);
  auVar10 = vpinsrd_avx(auVar10,5,2);
  auVar10 = vpinsrd_avx(auVar10,7,3);
  uStack_170 = auVar10._0_8_;
  uStack_168 = auVar10._8_8_;
  lVar7 = *(long *)(in_RSI + 2);
  uVar21 = (ulong)(iVar4 / 4 << 2);
  local_6a0 = 0;
  for (local_6a8 = 0; local_6a8 < uVar21; local_6a8 = local_6a8 + 4) {
    uVar6 = *(uint *)(in_RDI + local_6a8);
    auVar10 = vpinsrd_avx(ZEXT416(uVar6),uVar6,1);
    auVar10 = vpinsrd_avx(auVar10,uVar6,2);
    auVar10 = vpinsrd_avx(auVar10,uVar6,3);
    auVar11 = vpinsrd_avx(ZEXT416(uVar6),uVar6,1);
    auVar11 = vpinsrd_avx(auVar11,uVar6,2);
    auVar11 = vpinsrd_avx(auVar11,uVar6,3);
    uStack_130 = auVar11._0_8_;
    uStack_128 = auVar11._8_8_;
    auVar17._16_8_ = uStack_130;
    auVar17._0_16_ = auVar10;
    auVar17._24_8_ = uStack_128;
    auVar14._16_8_ = uStack_70;
    auVar14._0_16_ = auVar12;
    auVar14._24_8_ = uStack_68;
    auVar14 = vpand_avx2(auVar17,auVar14);
    auVar14 = vpsadbw_avx2(auVar14,ZEXT1632(ZEXT816(0)));
    auVar18._8_8_ = local_6a0;
    auVar18._0_8_ = local_6a0;
    auVar18._16_8_ = local_6a0;
    auVar18._24_8_ = local_6a0;
    auVar14 = vpaddd_avx2(auVar18,auVar14);
    uStack_688 = auVar14._24_8_;
    auVar20._16_8_ = uStack_170;
    auVar20._0_16_ = auVar13;
    auVar20._24_8_ = uStack_168;
    auVar14 = vpermd_avx2(auVar20,auVar14);
    local_380 = auVar14._0_8_;
    uStack_378 = auVar14._8_8_;
    puVar1 = (undefined8 *)(lVar7 + local_6a8 * 4);
    *puVar1 = local_380;
    puVar1[1] = uStack_378;
    local_6a0 = uStack_688;
  }
  local_714 = *(int *)(lVar7 + (local_6a8 - 1) * 4);
  for (; local_6a8 < (ulong)(long)iVar4; local_6a8 = local_6a8 + 1) {
    local_714 = (uint)*(byte *)(in_RDI + local_6a8) + local_714;
    *(int *)(lVar7 + local_6a8 * 4) = local_714;
  }
  lVar8 = *(long *)(in_RSI + 2);
  for (local_738 = 1; local_738 < (ulong)(long)iVar5; local_738 = local_738 + 1) {
    auVar23 = ZEXT1632(ZEXT816(0));
    for (local_768 = 0; auVar25 = ZEXT3264(auVar23), local_768 < uVar21; local_768 = local_768 + 4)
    {
      uVar6 = *(uint *)(local_768 + in_RDI + local_738 * (long)iVar4);
      auVar10 = vpinsrd_avx(ZEXT416(uVar6),uVar6,1);
      auVar10 = vpinsrd_avx(auVar10,uVar6,2);
      auVar10 = vpinsrd_avx(auVar10,uVar6,3);
      auVar11 = vpinsrd_avx(ZEXT416(uVar6),uVar6,1);
      auVar11 = vpinsrd_avx(auVar11,uVar6,2);
      auVar11 = vpinsrd_avx(auVar11,uVar6,3);
      uStack_f0 = auVar11._0_8_;
      uStack_e8 = auVar11._8_8_;
      auVar16._16_8_ = uStack_f0;
      auVar16._0_16_ = auVar10;
      auVar16._24_8_ = uStack_e8;
      auVar15._16_8_ = uStack_70;
      auVar15._0_16_ = auVar12;
      auVar15._24_8_ = uStack_68;
      auVar14 = vpand_avx2(auVar16,auVar15);
      auVar14 = vpsadbw_avx2(auVar14,ZEXT1632(ZEXT816(0)));
      auVar14 = vpaddd_avx2(auVar23,auVar14);
      uStack_748 = auVar14._24_8_;
      auVar19._16_8_ = uStack_170;
      auVar19._0_16_ = auVar13;
      auVar19._24_8_ = uStack_168;
      auVar14 = vpermd_avx2(auVar19,auVar14);
      pauVar2 = (undefined1 (*) [16])(lVar7 + (local_738 - 1) * (long)iVar3 * 4 + local_768 * 4);
      auVar11 = *pauVar2;
      auVar10 = vcvtdq2ps_avx(*pauVar2);
      local_1c0 = auVar10._0_4_;
      fStack_1bc = auVar10._4_4_;
      fStack_1b8 = auVar10._8_4_;
      fStack_1b4 = auVar10._12_4_;
      puVar1 = (undefined8 *)(lVar8 + (local_738 - 1) * (long)iVar3 * 4 + local_768 * 4);
      *puVar1 = CONCAT44(fStack_1bc * 0.003921569,local_1c0 * 0.003921569);
      puVar1[1] = CONCAT44(fStack_1b4 * 0.003921569,fStack_1b8 * 0.003921569);
      auVar10 = vpaddd_avx(auVar14._0_16_,auVar11);
      puVar1 = (undefined8 *)(lVar7 + local_738 * (long)iVar3 * 4 + local_768 * 4);
      local_810 = auVar10._0_8_;
      uStack_808 = auVar10._8_8_;
      *puVar1 = local_810;
      puVar1[1] = uStack_808;
      auVar23._8_8_ = uStack_748;
      auVar23._0_8_ = uStack_748;
      auVar23._16_8_ = uStack_748;
      auVar23._24_8_ = uStack_748;
    }
    local_814 = *(int *)(lVar7 + (local_738 * (long)iVar3 + local_768 + -1) * 4) -
                *(int *)(lVar7 + ((local_738 - 1) * (long)iVar3 + local_768 + -1) * 4);
    for (; local_768 < (ulong)(long)iVar4; local_768 = local_768 + 1) {
      local_814 = local_814 + (uint)*(byte *)(in_RDI + local_738 * (long)iVar4 + local_768);
      auVar10 = vcvtusi2ss_avx512f(auVar25._0_16_,
                                   *(undefined4 *)
                                    (lVar7 + ((local_738 - 1) * (long)iVar3 + local_768) * 4));
      auVar11 = vcvtusi2ss_avx512f(auVar10,local_814);
      uVar22 = vcvttss2usi_avx512f(ZEXT416((uint)(auVar11._0_4_ + auVar10._0_4_)));
      *(undefined4 *)(lVar7 + (local_738 * (long)iVar3 + local_768) * 4) = uVar22;
      fVar9 = auVar10._0_4_ * 0.003921569;
      auVar25 = ZEXT464((uint)fVar9);
      *(float *)(lVar8 + ((local_738 - 1) * (long)iVar3 + local_768) * 4) = fVar9;
    }
  }
  auVar13 = vinsertps_avx(ZEXT416(0x3b808081),ZEXT416(0x3b808081),0x10);
  auVar13 = vinsertps_avx(auVar13,ZEXT416(0x3b808081),0x20);
  auVar13 = vinsertps_avx(auVar13,ZEXT416(0x3b808081),0x30);
  auVar10 = vinsertps_avx(ZEXT416(0x3b808081),ZEXT416(0x3b808081),0x10);
  auVar10 = vinsertps_avx(auVar10,ZEXT416(0x3b808081),0x20);
  auVar10 = vinsertps_avx(auVar10,ZEXT416(0x3b808081),0x30);
  auVar24._16_16_ = auVar13;
  auVar24._0_16_ = auVar10;
  for (local_848 = 0; auVar25 = ZEXT3264(auVar24), local_848 < (ulong)(long)(iVar4 + -7);
      local_848 = local_848 + 8) {
    auVar14 = vcvtdq2ps_avx(*(undefined1 (*) [32])
                             (lVar7 + (long)((iVar5 + -1) * iVar3) * 4 + local_848 * 4));
    local_220 = auVar10._0_4_;
    fStack_21c = auVar10._4_4_;
    fStack_218 = auVar10._8_4_;
    fStack_214 = auVar10._12_4_;
    fStack_210 = auVar13._0_4_;
    fStack_20c = auVar13._4_4_;
    fStack_208 = auVar13._8_4_;
    uStack_204 = auVar13._12_4_;
    local_240 = auVar14._0_4_;
    fStack_23c = auVar14._4_4_;
    fStack_238 = auVar14._8_4_;
    fStack_234 = auVar14._12_4_;
    fStack_230 = auVar14._16_4_;
    fStack_22c = auVar14._20_4_;
    fStack_228 = auVar14._24_4_;
    auVar24._4_4_ = fStack_21c * fStack_23c;
    auVar24._0_4_ = local_220 * local_240;
    auVar24._12_4_ = fStack_214 * fStack_234;
    auVar24._8_4_ = fStack_218 * fStack_238;
    auVar24._20_4_ = fStack_20c * fStack_22c;
    auVar24._16_4_ = fStack_210 * fStack_230;
    auVar24._28_4_ = uStack_204;
    auVar24._24_4_ = fStack_208 * fStack_228;
    *(undefined1 (*) [32])(lVar8 + (long)((iVar5 + -1) * iVar3) * 4 + local_848 * 4) = auVar24;
  }
  for (; local_848 < (ulong)(long)iVar4; local_848 = local_848 + 1) {
    auVar13 = vcvtusi2ss_avx512f(auVar25._0_16_,
                                 *(undefined4 *)
                                  (lVar7 + ((long)((iVar5 + -1) * iVar3) + local_848) * 4));
    fVar9 = auVar13._0_4_ * 0.003921569;
    auVar25 = ZEXT464((uint)fVar9);
    *(float *)(lVar8 + ((long)((iVar5 + -1) * iVar3) + local_848) * 4) = fVar9;
  }
  return;
}

Assistant:

void compute_integral_img_simd_early_cast_int(uint8_t *gray_image, struct integral_image *iimage) {
    
    // Implementation adapted from:
    // https://stackoverflow.com/questions/46520275/how-to-speed-up-calculation-of-integral-image
    // https://github.com/ermig1979/Simd/blob/master/src/Simd/SimdAvx2Integral.cpp

    int data_width = iimage->data_width;
    int width = iimage->width;
    int height = iimage->height;

    __m256i MASK = _mm256_setr_epi64x(0x00000000000000FF, 0x000000000000FFFF, 0x0000000000FFFFFF, 0x00000000FFFFFFFF);
    __m256i PACK = _mm256_setr_epi32(0, 2, 4, 6, 1, 3, 5, 7);
    //__m256i ZERO = _mm256_set1_epi32(0);
    __m256i ZERO = _mm256_setzero_si256();

    uint32_t *iimage_idata = (uint32_t *) iimage->data;

    size_t aligned_width = width / 4 * 4;

    {
        __m256i row_sums = ZERO;
        size_t i = 0;
        for(; i < aligned_width; i+=4) {

            // If (gray_image + i) has following uint8_t pixels: a b c d
            // a0000000 ab000000 abc00000 abcd0000
            __m256i img_rep_mask = _mm256_and_si256(_mm256_set1_epi32(*(uint32_t*)(gray_image + i)), MASK);
            
            // Summing together blocks of 8 uint8_t's and storing results
            // uint32_t eeee = a
            // uint32_t ffff = a + b
            // uint32_t gggg = a + b + c
            // uint32_t hhhh = a + b + c + d
            // eeee0000 ffff0000 gggg0000 hhhh0000
            __m256i img_sad_sum = _mm256_sad_epu8(img_rep_mask, ZERO);

            // Updating row_sum by adding previously computed img_sad_sum
            //   eeee0000 ffff0000 hhhh0000 hhhh0000
            // + iiii**** jjjj**** kkkk**** llll****
            // -------------------------------------
            //   mmmm**** nnnn**** oooo**** pppp****
            row_sums = _mm256_add_epi32(row_sums, img_sad_sum);

            // Permuting row_sum from first row to second and cutting off upper 128 bits
            // mmmm**** nnnn**** oooo**** pppp****
            // mmmmnnnn oooopppp ******** ********
            __m128i curr_row_sums = _mm256_castsi256_si128(_mm256_permutevar8x32_epi32(row_sums, PACK));
            
            // Storing 128 bits (4*uint32_t) in curr_row_sums back to memory
            // 
            _mm_storeu_si128((__m128i*)(iimage_idata + i), curr_row_sums); // For unaligned
            //_mm_store_si128((__m128i *)(iimage_idata + i), curr_row_sums);
            
            // Updating row_sums to only include highest of four values (pppp)
            // mmmm**** nnnn**** oooo**** pppp****
            // pppp**** pppp**** pppp**** pppp****
            row_sums = _mm256_permute4x64_epi64(row_sums, 0xFF);

        }
        uint32_t row_sum = iimage_idata[i - 1];
        for (; i < width; ++i) {
            row_sum += gray_image[i];
            iimage_idata[i] = row_sum;
        }
    }

    float *iimage_data = iimage->data;
    __m128 factor = _mm_set1_ps(1.0f / 255.0f);

    for(size_t j = 1; j < height; ++j) {

        __m256i row_sums = ZERO;

        size_t i = 0;
        for(; i < aligned_width; i+=4) {

            // If (gray_image + i) has following uint8_t pixels: a b c d
            // a0000000 ab000000 abc00000 abcd0000
            __m256i img_rep_mask = _mm256_and_si256(_mm256_set1_epi32(*(uint32_t*)(gray_image + j * width + i)), MASK);
            
            // Summing together blocks of 8 uint8_t's and storing results
            // uint32_t eeee = a
            // uint32_t ffff = a + b
            // uint32_t gggg = a + b + c
            // uint32_t hhhh = a + b + c + d
            // eeee0000 ffff0000 gggg0000 hhhh0000
            __m256i img_sad_sum = _mm256_sad_epu8(img_rep_mask, ZERO);

            // Updating row_sum by adding previously computed img_sad_sum
            //   eeee0000 ffff0000 hhhh0000 hhhh0000
            // + iiii**** jjjj**** kkkk**** llll****
            // -------------------------------------
            //   mmmm**** nnnn**** oooo**** pppp****
            row_sums = _mm256_add_epi32(row_sums, img_sad_sum);

            // Permuting row_sum from first row to second and cutting off upper 128 bits
            // mmmm**** nnnn**** oooo**** pppp****
            // mmmmnnnn oooopppp ******** ********
            __m128i curr_row_sums = _mm256_castsi256_si128(_mm256_permutevar8x32_epi32(row_sums, PACK));

            // Loading row_sum from previous row
            __m128i prev_row_sums = _mm_loadu_si128((__m128i *)(iimage_idata + (j-1) * data_width + i));
            //__m128i prev_row_sums = _mm_load_si128((__m128i *)(iimage_idata + (j-1) * data_width + i));

            // AVX512 only :(
            //__m128 prev_row_sums_cast = _mm_cvtepu32_ps(prev_row_sums);
            __m128 prev_row_sums_cast = _mm_cvtepi32_ps(prev_row_sums);
            //__128 prev_row_sums_cast = _my_mm_cvtepu32_ps(prev_row_sums);

            // Multiplying float version of previous row sum converted with (1.0f/255.0f) 
            __m128 prev_iimage_float = _mm_mul_ps(factor, prev_row_sums_cast);

            // Storing float of previous row sum back to memory as final integral image value
            _mm_storeu_ps(iimage_data +(j-1) * data_width + i, prev_iimage_float);

            // Adding curr_row_sums with prev_row_sums
            __m128i add_row_sums = _mm_add_epi32(curr_row_sums, prev_row_sums);

            // Storing 128 bits (4*uint32_t) in curr_row_sums back to memory
            _mm_storeu_si128((__m128i *)(iimage_idata + j * data_width + i), add_row_sums); // For unaligned
            //_mm_store_si128((__m128i *)(iimage_idata + j * data_width + i), add_row_sums);
            
            // Updating row_sums to only include highest of four values (pppp)
            // mmmm**** nnnn**** oooo**** pppp****
            // pppp**** pppp**** pppp**** pppp****
            row_sums = _mm256_permute4x64_epi64(row_sums, 0xFF);

        }

        uint32_t row_sum = iimage_idata[j * data_width + i - 1] - iimage_idata[(j-1) * data_width + i - 1];
        for (; i < width; ++i) {
            row_sum += gray_image[j * width + i];
            float prev_row_sum = iimage_idata[(j-1) * data_width + i];
            iimage_idata[j * data_width + i] = row_sum + prev_row_sum;
            iimage_data[(j-1) * data_width + i] = (1.0f / 255.0f) * ((float) prev_row_sum);
        }

    }

    // Converting last row to floats
    __m256 factor256 = _mm256_set1_ps(1.0f / 255.0f);
    size_t i = 0;
    for (; i < width - 7; i+=8) {

        __m256i v_int = _mm256_loadu_si256((__m256i *)(iimage_idata + (height - 1) * data_width + i));
        //__m256i v_int = _mm256_load_si256((__m256i *)(iimage_idata + j * data_width + i));

        // AVX512 only :(
        //__m256 v_float = _mm256_cvtepu32_ps(v_int);
        __m256 v_float = _mm256_cvtepi32_ps(v_int);
        //__m256 v_float = _my_mm256_cvtepu32_ps(v_int);

        // Multiplying converted float with (1.0f/255.0f) 
        __m256 v_iimage = _mm256_mul_ps(factor256, v_float);

        // Storing value back to memory
        _mm256_storeu_ps(iimage_data + (height - 1) * data_width + i, v_iimage);

    } 

    for (; i < width; ++i) {
        iimage_data[(height - 1) * data_width + i] = (1.0f / 255.0f) * ((float) iimage_idata[(height - 1) * data_width + i]);
    }

}